

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O1

int secp256k1_ec_pubkey_cmp
              (secp256k1_context *ctx,secp256k1_pubkey *pubkey0,secp256k1_pubkey *pubkey1)

{
  int iVar1;
  long in_RCX;
  char *extraout_RDX;
  long lVar2;
  byte *output;
  uchar *sigend;
  size_t out_size;
  secp256k1_pubkey *pk [2];
  uchar out [2] [33];
  uchar *puStack_b0;
  uint uStack_a8;
  secp256k1_scalar sStack_a4;
  size_t sStack_a0;
  size_t local_80;
  secp256k1_pubkey *local_78 [2];
  byte local_68 [33];
  byte abStack_47 [39];
  
  if (ctx != (secp256k1_context *)0x0) {
    local_78[0] = pubkey0;
    local_78[1] = pubkey1;
    output = local_68;
    lVar2 = 0;
    do {
      local_80 = 0x21;
      iVar1 = secp256k1_ec_pubkey_serialize(ctx,output,&local_80,local_78[lVar2],0x102);
      if (iVar1 == 0) {
        output[0x10] = 0;
        output[0x11] = 0;
        output[0x12] = 0;
        output[0x13] = 0;
        output[0x14] = 0;
        output[0x15] = 0;
        output[0x16] = 0;
        output[0x17] = 0;
        output[0x18] = 0;
        output[0x19] = 0;
        output[0x1a] = 0;
        output[0x1b] = 0;
        output[0x1c] = 0;
        output[0x1d] = 0;
        output[0x1e] = 0;
        output[0x1f] = 0;
        output[0] = 0;
        output[1] = 0;
        output[2] = 0;
        output[3] = 0;
        output[4] = 0;
        output[5] = 0;
        output[6] = 0;
        output[7] = 0;
        output[8] = 0;
        output[9] = 0;
        output[10] = 0;
        output[0xb] = 0;
        output[0xc] = 0;
        output[0xd] = 0;
        output[0xe] = 0;
        output[0xf] = 0;
        output[0x20] = 0;
      }
      lVar2 = lVar2 + 1;
      output = output + 0x21;
    } while (lVar2 == 1);
    lVar2 = 0;
    do {
      if (local_68[lVar2] != abStack_47[lVar2]) {
        return (uint)local_68[lVar2] - (uint)abStack_47[lVar2];
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 != 0x21);
    return 0;
  }
  secp256k1_ec_pubkey_cmp_cold_1();
  if (ctx == (secp256k1_context *)0x0) {
    secp256k1_ecdsa_signature_parse_der_cold_3();
  }
  else if (pubkey0 != (secp256k1_pubkey *)0x0) {
    if (extraout_RDX == (char *)0x0) {
      secp256k1_ecdsa_signature_parse_der_cold_1();
      return 0;
    }
    if ((in_RCX != 0) && (puStack_b0 = (uchar *)(extraout_RDX + 1), *extraout_RDX == '0')) {
      sigend = (uchar *)(extraout_RDX + in_RCX);
      iVar1 = secp256k1_der_read_len(&sStack_a0,&puStack_b0,sigend);
      if (((iVar1 != 0) &&
          (((sStack_a0 == (long)sigend - (long)puStack_b0 &&
            (iVar1 = secp256k1_der_parse_integer(&sStack_a4,&puStack_b0,sigend), iVar1 != 0)) &&
           (iVar1 = secp256k1_der_parse_integer(&uStack_a8,&puStack_b0,sigend), iVar1 != 0)))) &&
         (puStack_b0 == sigend)) {
        pubkey0->data[0x10] = '\0';
        pubkey0->data[0x11] = '\0';
        pubkey0->data[0x12] = '\0';
        pubkey0->data[0x13] = '\0';
        pubkey0->data[0x14] = '\0';
        pubkey0->data[0x15] = '\0';
        pubkey0->data[0x16] = '\0';
        pubkey0->data[0x17] = '\0';
        pubkey0->data[0x18] = '\0';
        pubkey0->data[0x19] = '\0';
        pubkey0->data[0x1a] = '\0';
        pubkey0->data[0x1b] = '\0';
        pubkey0->data[0x1c] = '\0';
        pubkey0->data[0x1d] = '\0';
        pubkey0->data[0x1e] = '\0';
        pubkey0->data[0x1f] = '\0';
        pubkey0->data[0] = '\0';
        pubkey0->data[1] = '\0';
        pubkey0->data[2] = '\0';
        pubkey0->data[3] = '\0';
        pubkey0->data[4] = '\0';
        pubkey0->data[5] = '\0';
        pubkey0->data[6] = '\0';
        pubkey0->data[7] = '\0';
        pubkey0->data[8] = '\0';
        pubkey0->data[9] = '\0';
        pubkey0->data[10] = '\0';
        pubkey0->data[0xb] = '\0';
        pubkey0->data[0xc] = '\0';
        pubkey0->data[0xd] = '\0';
        pubkey0->data[0xe] = '\0';
        pubkey0->data[0xf] = '\0';
        pubkey0->data[0x1c] = (uchar)(sStack_a4 >> 0x18);
        pubkey0->data[0x1d] = (uchar)(sStack_a4 >> 0x10);
        pubkey0->data[0x1e] = (uchar)(sStack_a4 >> 8);
        pubkey0->data[0x1f] = (uchar)sStack_a4;
        pubkey0->data[0x20] = '\0';
        pubkey0->data[0x21] = '\0';
        pubkey0->data[0x22] = '\0';
        pubkey0->data[0x23] = '\0';
        pubkey0->data[0x24] = '\0';
        pubkey0->data[0x25] = '\0';
        pubkey0->data[0x26] = '\0';
        pubkey0->data[0x27] = '\0';
        pubkey0->data[0x28] = '\0';
        pubkey0->data[0x29] = '\0';
        pubkey0->data[0x2a] = '\0';
        pubkey0->data[0x2b] = '\0';
        pubkey0->data[0x2c] = '\0';
        pubkey0->data[0x2d] = '\0';
        pubkey0->data[0x2e] = '\0';
        pubkey0->data[0x2f] = '\0';
        pubkey0->data[0x30] = '\0';
        pubkey0->data[0x31] = '\0';
        pubkey0->data[0x32] = '\0';
        pubkey0->data[0x33] = '\0';
        pubkey0->data[0x34] = '\0';
        pubkey0->data[0x35] = '\0';
        pubkey0->data[0x36] = '\0';
        pubkey0->data[0x37] = '\0';
        pubkey0->data[0x38] = '\0';
        pubkey0->data[0x39] = '\0';
        pubkey0->data[0x3a] = '\0';
        pubkey0->data[0x3b] = '\0';
        pubkey0->data[0x3c] = '\0';
        pubkey0->data[0x3d] = '\0';
        pubkey0->data[0x3e] = '\0';
        pubkey0->data[0x3f] = '\0';
        *(uint *)(pubkey0->data + 0x3c) =
             uStack_a8 >> 0x18 | (uStack_a8 & 0xff0000) >> 8 | (uStack_a8 & 0xff00) << 8 |
             uStack_a8 << 0x18;
        return 1;
      }
    }
    pubkey0->data[0x30] = '\0';
    pubkey0->data[0x31] = '\0';
    pubkey0->data[0x32] = '\0';
    pubkey0->data[0x33] = '\0';
    pubkey0->data[0x34] = '\0';
    pubkey0->data[0x35] = '\0';
    pubkey0->data[0x36] = '\0';
    pubkey0->data[0x37] = '\0';
    pubkey0->data[0x38] = '\0';
    pubkey0->data[0x39] = '\0';
    pubkey0->data[0x3a] = '\0';
    pubkey0->data[0x3b] = '\0';
    pubkey0->data[0x3c] = '\0';
    pubkey0->data[0x3d] = '\0';
    pubkey0->data[0x3e] = '\0';
    pubkey0->data[0x3f] = '\0';
    pubkey0->data[0x20] = '\0';
    pubkey0->data[0x21] = '\0';
    pubkey0->data[0x22] = '\0';
    pubkey0->data[0x23] = '\0';
    pubkey0->data[0x24] = '\0';
    pubkey0->data[0x25] = '\0';
    pubkey0->data[0x26] = '\0';
    pubkey0->data[0x27] = '\0';
    pubkey0->data[0x28] = '\0';
    pubkey0->data[0x29] = '\0';
    pubkey0->data[0x2a] = '\0';
    pubkey0->data[0x2b] = '\0';
    pubkey0->data[0x2c] = '\0';
    pubkey0->data[0x2d] = '\0';
    pubkey0->data[0x2e] = '\0';
    pubkey0->data[0x2f] = '\0';
    pubkey0->data[0x10] = '\0';
    pubkey0->data[0x11] = '\0';
    pubkey0->data[0x12] = '\0';
    pubkey0->data[0x13] = '\0';
    pubkey0->data[0x14] = '\0';
    pubkey0->data[0x15] = '\0';
    pubkey0->data[0x16] = '\0';
    pubkey0->data[0x17] = '\0';
    pubkey0->data[0x18] = '\0';
    pubkey0->data[0x19] = '\0';
    pubkey0->data[0x1a] = '\0';
    pubkey0->data[0x1b] = '\0';
    pubkey0->data[0x1c] = '\0';
    pubkey0->data[0x1d] = '\0';
    pubkey0->data[0x1e] = '\0';
    pubkey0->data[0x1f] = '\0';
    pubkey0->data[0] = '\0';
    pubkey0->data[1] = '\0';
    pubkey0->data[2] = '\0';
    pubkey0->data[3] = '\0';
    pubkey0->data[4] = '\0';
    pubkey0->data[5] = '\0';
    pubkey0->data[6] = '\0';
    pubkey0->data[7] = '\0';
    pubkey0->data[8] = '\0';
    pubkey0->data[9] = '\0';
    pubkey0->data[10] = '\0';
    pubkey0->data[0xb] = '\0';
    pubkey0->data[0xc] = '\0';
    pubkey0->data[0xd] = '\0';
    pubkey0->data[0xe] = '\0';
    pubkey0->data[0xf] = '\0';
    return 0;
  }
  secp256k1_ecdsa_signature_parse_der_cold_2();
  return 0;
}

Assistant:

int secp256k1_ec_pubkey_cmp(const secp256k1_context* ctx, const secp256k1_pubkey* pubkey0, const secp256k1_pubkey* pubkey1) {
    unsigned char out[2][33];
    const secp256k1_pubkey* pk[2];
    int i;

    VERIFY_CHECK(ctx != NULL);
    pk[0] = pubkey0; pk[1] = pubkey1;
    for (i = 0; i < 2; i++) {
        size_t out_size = sizeof(out[i]);
        /* If the public key is NULL or invalid, ec_pubkey_serialize will call
         * the illegal_callback and return 0. In that case we will serialize the
         * key as all zeros which is less than any valid public key. This
         * results in consistent comparisons even if NULL or invalid pubkeys are
         * involved and prevents edge cases such as sorting algorithms that use
         * this function and do not terminate as a result. */
        if (!secp256k1_ec_pubkey_serialize(ctx, out[i], &out_size, pk[i], SECP256K1_EC_COMPRESSED)) {
            /* Note that ec_pubkey_serialize should already set the output to
             * zero in that case, but it's not guaranteed by the API, we can't
             * test it and writing a VERIFY_CHECK is more complex than
             * explicitly memsetting (again). */
            memset(out[i], 0, sizeof(out[i]));
        }
    }
    return secp256k1_memcmp_var(out[0], out[1], sizeof(out[0]));
}